

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall calculator::SyntaxError::SyntaxError(SyntaxError *this,string *error)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *error_local;
  SyntaxError *this_local;
  
  local_18 = error;
  error_local = (string *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__SyntaxError_00136710;
  std::__cxx11::string::string((string *)&this->error_msg);
  std::operator+(&local_38,"Error: ",local_18);
  std::__cxx11::string::operator=((string *)&this->error_msg,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

SyntaxError(const std::string& error = "") {
        error_msg = "Error: " + error;
    }